

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

void __thiscall
chaiscript::eval::Int_AST_Node::Int_AST_Node
          (Int_AST_Node *this,string *t_ast_node_text,Parse_Location *t_loc,Boxed_Value *t_bv)

{
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  *in_RCX;
  Parse_Location *in_RDX;
  string *in_RSI;
  undefined8 *in_RDI;
  Parse_Location *in_stack_ffffffffffffff68;
  Parse_Location *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff94;
  string *in_stack_ffffffffffffff98;
  AST_Node *in_stack_ffffffffffffffa0;
  string local_40 [64];
  
  std::__cxx11::string::string(local_40,in_RSI);
  Parse_Location::Parse_Location(in_RDX,in_stack_ffffffffffffff68);
  memset(&stack0xffffffffffffff88,0,0x18);
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ::vector((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
            *)0x2429bf);
  AST_Node::AST_Node(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                     in_stack_ffffffffffffff88,in_RCX);
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ::~vector(in_RCX);
  Parse_Location::~Parse_Location((Parse_Location *)0x2429f1);
  std::__cxx11::string::~string(local_40);
  *in_RDI = &PTR_pretty_print_abi_cxx11__005c0390;
  Boxed_Value::Boxed_Value((Boxed_Value *)in_RDX,(Boxed_Value *)in_stack_ffffffffffffff68);
  return;
}

Assistant:

Int_AST_Node(std::string t_ast_node_text, Parse_Location t_loc, Boxed_Value t_bv) :
          AST_Node(std::move(t_ast_node_text), AST_Node_Type::Int, std::move(t_loc)), 
          m_value(std::move(t_bv)) { assert(text != ""); }